

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O2

int Saig_ManDemiterSimpleDiff_old(Aig_Man_t *p,Aig_Man_t **ppAig0,Aig_Man_t **ppAig1)

{
  Aig_Man_t **ppAVar1;
  Aig_Man_t **ppAVar2;
  int iVar3;
  Vec_Ptr_t *vSet;
  Vec_Ptr_t *vSet_00;
  void *pvVar4;
  Aig_Man_t *pAVar5;
  char *pcVar6;
  uint i;
  Aig_Obj_t *pAVar7;
  Aig_Obj_t *pObj0;
  Aig_Obj_t *pObj1;
  Aig_Man_t **local_40;
  Aig_Man_t **local_38;
  
  local_40 = ppAig0;
  local_38 = ppAig1;
  vSet = Vec_PtrAlloc(p->nTruePos);
  vSet_00 = Vec_PtrAlloc(p->nTruePos);
  i = 0;
  do {
    ppAVar2 = local_38;
    ppAVar1 = local_40;
    if (p->nTruePos <= (int)i) {
      if (local_40 != (Aig_Man_t **)0x0) {
        pAVar5 = Aig_ManDupNodesAll(p,vSet);
        *ppAVar1 = pAVar5;
        if (pAVar5->pName != (char *)0x0) {
          free(pAVar5->pName);
          (*ppAVar1)->pName = (char *)0x0;
        }
        pcVar6 = Abc_UtilStrsav("part0");
        (*ppAVar1)->pName = pcVar6;
      }
      if (ppAVar2 != (Aig_Man_t **)0x0) {
        pAVar5 = Aig_ManDupNodesAll(p,vSet_00);
        *ppAVar2 = pAVar5;
        if (pAVar5->pName != (char *)0x0) {
          free(pAVar5->pName);
          (*ppAVar2)->pName = (char *)0x0;
        }
        pcVar6 = Abc_UtilStrsav("part1");
        (*ppAVar2)->pName = pcVar6;
      }
      Vec_PtrFree(vSet);
      Vec_PtrFree(vSet_00);
      return 1;
    }
    pvVar4 = Vec_PtrEntry(p->vCos,i);
    pAVar7 = (Aig_Obj_t *)(*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe);
    iVar3 = Aig_ObjIsConst1(pAVar7);
    if (iVar3 == 0) {
      if (0xfffffffd < (*(uint *)&pAVar7->field_0x18 & 7) - 7) {
        iVar3 = Aig_ObjRecognizeExor(pAVar7,&pObj0,&pObj1);
        if (iVar3 != 0) {
          if ((*(byte *)((long)pvVar4 + 8) & 1) != 0) {
            pObj0 = (Aig_Obj_t *)((ulong)pObj0 ^ 1);
          }
          if (*(int *)(((ulong)pObj0 & 0xfffffffffffffffe) + 0x24) <
              *(int *)(((ulong)pObj1 & 0xfffffffffffffffe) + 0x24)) {
            Vec_PtrPush(vSet,pObj0);
            pAVar7 = pObj1;
          }
          else {
            Vec_PtrPush(vSet,pObj1);
            pAVar7 = pObj0;
          }
          Vec_PtrPush(vSet_00,pAVar7);
          goto LAB_00544755;
        }
      }
      pcVar6 = "The output number %d cannot be demitered.\n";
LAB_0054474b:
      printf(pcVar6,(ulong)i);
    }
    else if ((*(byte *)((long)pvVar4 + 8) & 1) == 0) {
      pcVar6 = "The output number %d of the miter is constant 1.\n";
      goto LAB_0054474b;
    }
LAB_00544755:
    i = i + 1;
  } while( true );
}

Assistant:

int Saig_ManDemiterSimpleDiff_old( Aig_Man_t * p, Aig_Man_t ** ppAig0, Aig_Man_t ** ppAig1 )
{
    Vec_Ptr_t * vSet0, * vSet1;
    Aig_Obj_t * pObj, * pFanin, * pObj0, * pObj1;
    int i, Counter = 0;
//    assert( Saig_ManRegNum(p) % 2 == 0 );
    vSet0 = Vec_PtrAlloc( Saig_ManPoNum(p) );
    vSet1 = Vec_PtrAlloc( Saig_ManPoNum(p) );
    Saig_ManForEachPo( p, pObj, i )
    {
        pFanin = Aig_ObjFanin0(pObj);
        if ( Aig_ObjIsConst1( pFanin ) )
        {
            if ( !Aig_ObjFaninC0(pObj) )
                printf( "The output number %d of the miter is constant 1.\n", i );
            Counter++;
            continue;
        } 
        if ( !Aig_ObjIsNode(pFanin) || !Aig_ObjRecognizeExor( pFanin, &pObj0, &pObj1 ) )
        {
/*
            printf( "The miter cannot be demitered.\n" );
            Vec_PtrFree( vSet0 );
            Vec_PtrFree( vSet1 );
            return 0;
*/
            printf( "The output number %d cannot be demitered.\n", i );
            continue;
        }
        if ( Aig_ObjFaninC0(pObj) )
            pObj0 = Aig_Not(pObj0);

//        printf( "%d %d  ", Aig_Regular(pObj0)->Id, Aig_Regular(pObj1)->Id );
        if ( Aig_Regular(pObj0)->Id < Aig_Regular(pObj1)->Id )
        {
            Vec_PtrPush( vSet0, pObj0 );
            Vec_PtrPush( vSet1, pObj1 );
        }
        else
        {
            Vec_PtrPush( vSet0, pObj1 );
            Vec_PtrPush( vSet1, pObj0 );
        }
    }
//    printf( "Miter has %d constant outputs.\n", Counter );
//    printf( "\n" );
    if ( ppAig0 )
    {
        *ppAig0 = Aig_ManDupNodesAll( p, vSet0 );
        ABC_FREE( (*ppAig0)->pName );
        (*ppAig0)->pName = Abc_UtilStrsav( "part0" );
    }
    if ( ppAig1 )
    {
        *ppAig1 = Aig_ManDupNodesAll( p, vSet1 );
        ABC_FREE( (*ppAig1)->pName );
        (*ppAig1)->pName = Abc_UtilStrsav( "part1" );
    }
    Vec_PtrFree( vSet0 );
    Vec_PtrFree( vSet1 );
    return 1;
}